

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O3

ssize_t __thiscall RenX::LadderDatabase::write(LadderDatabase *this,int __fd,void *__buf,size_t __n)

{
  FILE *in_RAX;
  undefined4 in_register_00000034;
  size_t sVar1;
  Entry *pEVar2;
  DataBuffer buffer;
  uint64_t *local_30;
  
  if (this->m_entries != 0) {
    in_RAX = fopen((char *)CONCAT44(in_register_00000034,__fd),"wb");
    if (in_RAX != (FILE *)0x0) {
      Jupiter::DataBuffer::DataBuffer((DataBuffer *)&stack0xffffffffffffffc0);
      (**(code **)(*(long *)this + 0x10))(this,in_RAX);
      pEVar2 = this->m_head;
      if (pEVar2 != (Entry *)0x0) {
        sVar1 = 1;
        do {
          pEVar2->rank = sVar1;
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *local_30 = pEVar2->steam_id;
          local_30 = local_30 + 1;
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *local_30 = pEVar2->total_score;
          local_30 = local_30 + 1;
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_deaths;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_headshot_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_vehicle_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_building_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_defence_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_captures;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_game_time;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_games;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_wins;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_beacon_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_beacon_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_proxy_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_proxy_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_games;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_wins;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_ties;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_game_time;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *local_30 = pEVar2->total_gdi_score;
          local_30 = local_30 + 1;
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_beacon_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_beacon_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_proxy_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_proxy_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_deaths;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_vehicle_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_defence_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_building_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_gdi_headshots;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_games;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_wins;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_game_time;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *local_30 = pEVar2->total_nod_score;
          local_30 = local_30 + 1;
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_beacon_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_beacon_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_proxy_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_proxy_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_deaths;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_vehicle_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_defence_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_building_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->total_nod_headshots;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_score;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->most_deaths;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_headshot_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_vehicle_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_building_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_defence_kills;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_captures;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_game_time;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_beacon_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_beacon_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_proxy_placements;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->top_proxy_disarms;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *(uint32_t *)local_30 = pEVar2->most_recent_ip;
          local_30 = (uint64_t *)((long)local_30 + 4);
          Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
          *local_30 = pEVar2->last_game;
          local_30 = (uint64_t *)((long)local_30 + 8);
          _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
          push<char,std::char_traits<char>,std::allocator<char>>
                    ((DataBuffer *)&stack0xffffffffffffffc0,&pEVar2->most_recent_name);
          Jupiter::DataBuffer::push_to((_IO_FILE *)&stack0xffffffffffffffc0);
          pEVar2 = pEVar2->next;
          sVar1 = sVar1 + 1;
        } while (pEVar2 != (Entry *)0x0);
      }
      fclose(in_RAX);
      in_RAX = (FILE *)Jupiter::DataBuffer::~DataBuffer((DataBuffer *)&stack0xffffffffffffffc0);
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void RenX::LadderDatabase::write(const char *filename) {
	if (m_entries != 0)
	{
		FILE *file = fopen(filename, "wb");
		if (file != nullptr)
		{
			size_t rank = 0;
			Jupiter::DataBuffer buffer;
			create_header(file);
			Entry *entry = m_head;
			while (entry != nullptr)
			{
				// update rank
				entry->rank = ++rank;

				// push data from entry to buffer
				buffer.push(entry->steam_id);
				buffer.push(entry->total_score);

				buffer.push(entry->total_kills);
				buffer.push(entry->total_deaths);
				buffer.push(entry->total_headshot_kills);
				buffer.push(entry->total_vehicle_kills);
				buffer.push(entry->total_building_kills);
				buffer.push(entry->total_defence_kills);
				buffer.push(entry->total_captures);
				buffer.push(entry->total_game_time);
				buffer.push(entry->total_games);
				buffer.push(entry->total_wins);
				buffer.push(entry->total_beacon_placements);
				buffer.push(entry->total_beacon_disarms);
				buffer.push(entry->total_proxy_placements);
				buffer.push(entry->total_proxy_disarms);

				buffer.push(entry->total_gdi_games);
				buffer.push(entry->total_gdi_wins);
				buffer.push(entry->total_gdi_ties);
				buffer.push(entry->total_gdi_game_time);
				buffer.push(entry->total_gdi_score);
				buffer.push(entry->total_gdi_beacon_placements);
				buffer.push(entry->total_gdi_beacon_disarms);
				buffer.push(entry->total_gdi_proxy_placements);
				buffer.push(entry->total_gdi_proxy_disarms);
				buffer.push(entry->total_gdi_kills);
				buffer.push(entry->total_gdi_deaths);
				buffer.push(entry->total_gdi_vehicle_kills);
				buffer.push(entry->total_gdi_defence_kills);
				buffer.push(entry->total_gdi_building_kills);
				buffer.push(entry->total_gdi_headshots);

				buffer.push(entry->total_nod_games);
				buffer.push(entry->total_nod_wins);
				buffer.push(entry->total_nod_game_time);
				buffer.push(entry->total_nod_score);
				buffer.push(entry->total_nod_beacon_placements);
				buffer.push(entry->total_nod_beacon_disarms);
				buffer.push(entry->total_nod_proxy_placements);
				buffer.push(entry->total_nod_proxy_disarms);
				buffer.push(entry->total_nod_kills);
				buffer.push(entry->total_nod_deaths);
				buffer.push(entry->total_nod_vehicle_kills);
				buffer.push(entry->total_nod_defence_kills);
				buffer.push(entry->total_nod_building_kills);
				buffer.push(entry->total_nod_headshots);

				buffer.push(entry->top_score);
				buffer.push(entry->top_kills);
				buffer.push(entry->most_deaths);
				buffer.push(entry->top_headshot_kills);
				buffer.push(entry->top_vehicle_kills);
				buffer.push(entry->top_building_kills);
				buffer.push(entry->top_defence_kills);
				buffer.push(entry->top_captures);
				buffer.push(entry->top_game_time);
				buffer.push(entry->top_beacon_placements);
				buffer.push(entry->top_beacon_disarms);
				buffer.push(entry->top_proxy_placements);
				buffer.push(entry->top_proxy_disarms);

				buffer.push(entry->most_recent_ip);
				buffer.push(entry->last_game);
				buffer.push(entry->most_recent_name);

				// push buffer to file
				buffer.push_to(file);

				// iterate
				entry = entry->next;
			}
			fclose(file);
		}
	}
}